

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

void __thiscall adjMaxtrix<char>::DepthFirstSearch(adjMaxtrix<char> *this,_func_void_char *Visit)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  int *visited_00;
  int *visited;
  int i;
  _func_void_char *Visit_local;
  adjMaxtrix<char> *this_local;
  
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  visited_00 = (int *)operator_new__(uVar3);
  visited._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
    if (sVar2 <= (ulong)(long)visited._4_4_) break;
    visited_00[visited._4_4_] = 0;
    visited._4_4_ = visited._4_4_ + 1;
  }
  visited._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
    if (sVar2 <= (ulong)(long)visited._4_4_) break;
    if (visited_00[visited._4_4_] == 0) {
      DFS(this,visited._4_4_,visited_00,Visit);
    }
    visited._4_4_ = visited._4_4_ + 1;
  }
  if (visited_00 != (int *)0x0) {
    operator_delete__(visited_00);
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::DepthFirstSearch(void Visit(dataType item)) {
	int i;
	int *visited = new int[vexs.size()];
	for (i = 0; i < vexs.size(); i++)
		visited[i] = 0;			//初始标记数组
	for (i = 0; i < vexs.size(); i++)
		if (!visited[i])
			DFS(i, visited, Visit);	//以每个顶点为初始顶点进行调用
	delete[] visited;
}